

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::stream_socket::async_connect(stream_socket *this,endpoint *ep,event_handler *h)

{
  bool bVar1;
  pointer_type this_00;
  io_service *this_01;
  socklen_t in_ECX;
  event_handler local_38;
  error_code e;
  
  bVar1 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar1) {
    e._M_value = 0;
    e._M_cat = (error_category *)std::_V2::system_category();
    connect(this,(int)ep,(sockaddr *)&e,in_ECX);
    if ((e._M_value != 0) && (bVar1 = basic_io_device::would_block(&e), bVar1)) {
      this_00.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x20);
      callable<void_(const_std::error_code_&)>::callable(this_00.p_);
      ((this_00.p_)->super_refcounted)._vptr_refcounted =
           (_func_int **)&PTR__async_connector_001d9120;
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
                ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
                 (this_00.p_ + 1),&h->call_ptr);
      this_00.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)this;
      local_38.call_ptr.p_ = (pointer_type)(pointer_type)this_00.p_;
      atomic_counter::inc(&((this_00.p_)->super_refcounted).refs_);
      basic_io_device::on_writeable((basic_io_device *)this,&local_38);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_38.call_ptr);
      return;
    }
    this_01 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(this_01,h,&e);
  }
  return;
}

Assistant:

void stream_socket::async_connect(endpoint const &ep,event_handler const &h)
{
	if(!dont_block(h))
		return;
	system::error_code e;
	connect(ep,e);
	if(e && would_block(e)) {
		async_connector::pointer connector(new async_connector(h,this));
		on_writeable(std::move(connector));
	}
	else {
		get_io_service().post(h,e);
	}
}